

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QByteArray * qt_convert_to_latin1(QStringView string)

{
  bool bVar1;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QByteArray *ba;
  char16_t *in_stack_ffffffffffffff98;
  QStringView *this;
  QByteArray *size;
  QByteArray *in_stack_ffffffffffffffc8;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  size = in_RDI;
  bVar1 = QStringView::isNull(&local_18);
  if (bVar1) {
    QByteArray::QByteArray((QByteArray *)0x51275c);
  }
  else {
    (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
    this = &local_18;
    QStringView::size(this);
    QByteArray::QByteArray
              (in_stack_ffffffffffffffc8,(qsizetype)size,(Initialization)((ulong)in_RDI >> 0x20));
    QByteArray::constData((QByteArray *)0x5127ab);
    QStringView::utf16(this);
    QStringView::size(this);
    qt_to_latin1((uchar *)this,in_stack_ffffffffffffff98,0x5127db);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return size;
}

Assistant:

Q_NEVER_INLINE
static QByteArray qt_convert_to_latin1(QStringView string)
{
    if (Q_UNLIKELY(string.isNull()))
        return QByteArray();

    QByteArray ba(string.size(), Qt::Uninitialized);

    // since we own the only copy, we're going to const_cast the constData;
    // that avoids an unnecessary call to detach() and expansion code that will never get used
    qt_to_latin1(reinterpret_cast<uchar *>(const_cast<char *>(ba.constData())),
                 string.utf16(), string.size());
    return ba;
}